

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolsb.c
# Opt level: O2

int ffgclsb(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
           long elemincre,int nultyp,char nulval,char *array,char *nularray,int *anynul,int *status)

{
  uint uVar1;
  fitsfile *pfVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long nvals;
  int iVar8;
  uchar *values;
  bool bVar9;
  double dVar10;
  double dVar11;
  int local_71fc;
  double zero;
  double scale;
  uint local_71d4;
  int hdutype;
  int tcode;
  LONGLONG tnull;
  fitsfile *local_71c0;
  ulong local_71b8;
  long incre;
  int maxelem;
  long twidth;
  long local_7198;
  long local_7190;
  LONGLONG repeat;
  double local_7180;
  long local_7178;
  LONGLONG rowlen;
  LONGLONG startpos;
  int decimals;
  int xcode;
  char tform [20];
  char snull [20];
  long xwidth;
  char message [81];
  double cbuff [3600];
  
  iVar3 = *status;
  if (nelem != 0 && iVar3 < 1) {
    if (anynul != (int *)0x0) {
      *anynul = 0;
    }
    local_71d4 = colnum;
    local_71c0 = fptr;
    if (nultyp == 2) {
      memset(nularray,0,nelem);
    }
    pfVar2 = local_71c0;
    uVar1 = local_71d4;
    ffgcprll(local_71c0,local_71d4,firstrow,firstelem,nelem,(int)(elemincre >> 0x3f),&scale,&zero,
             tform,&twidth,&tcode,&maxelem,&startpos,(LONGLONG *)&local_71b8,&incre,&repeat,&rowlen,
             &hdutype,&tnull,snull,status);
    iVar8 = tcode;
    if (elemincre == 1 && tcode == 0xe) {
      ffgcll(pfVar2,uVar1,firstrow,firstelem,nelem,nultyp,nulval,array,nularray,anynul,status);
LAB_001524f9:
      iVar3 = *status;
    }
    else {
      pcVar4 = strchr(tform,0x41);
      iVar3 = *status;
      if (pcVar4 != (char *)0x0) {
        if (iVar3 == 0x134) {
          *status = 0;
          ffcmsg();
          iVar3 = *status;
        }
        tcode = 0xb;
        incre = 1;
        repeat = twidth;
        twidth = 1;
        zero = 0.0;
        scale = 1.0;
        tnull = 0x4995cdd1;
        maxelem = 0x7080;
        iVar8 = 0xb;
      }
      if (iVar3 < 1) {
        incre = incre * elemincre;
        local_7180 = 1.0;
        if ((iVar8 == 0x10) && (hdutype == 1)) {
          ffasfm(tform,&xcode,&xwidth,&decimals,status);
          uVar1 = 0;
          if (0 < decimals) {
            uVar1 = decimals;
          }
          uVar5 = (ulong)uVar1;
          local_7180 = 1.0;
          while (bVar9 = uVar5 != 0, uVar5 = uVar5 - 1, bVar9) {
            local_7180 = local_7180 * 10.0;
          }
        }
        local_71fc = 0;
        if ((((nultyp != 1 || nulval != '\0') && (tcode % 10 != 1 || tnull != 0x4995cdd1)) &&
            (tcode != 0x15 || (short)tnull == tnull)) && (tcode != 0xb || (ulong)tnull < 0x100)) {
          local_71fc = 0;
          if (snull[0] != '\x01') {
            local_71fc = nultyp;
          }
          if (tcode != 0x10) {
            local_71fc = nultyp;
          }
        }
        local_7178 = -elemincre;
        local_7190 = 0;
        local_7198 = 0;
LAB_001526fe:
        pcVar4 = nularray + local_7198;
        values = (uchar *)(array + local_7198);
        do {
          pfVar2 = local_71c0;
          if (nelem == 0) {
            if (*status != -0xb) {
              return *status;
            }
            ffpmsg("Numerical overflow during type conversion while reading FITS data.");
            *status = 0x19c;
            return 0x19c;
          }
          lVar7 = (long)maxelem;
          if (nelem < maxelem) {
            lVar7 = nelem;
          }
          if (elemincre < 0) {
            lVar6 = (long)local_71b8 / local_7178;
          }
          else {
            lVar6 = (long)(~local_71b8 + repeat) / elemincre;
          }
          nvals = lVar6 + 1;
          if (lVar7 <= lVar6) {
            nvals = lVar7;
          }
          lVar7 = (incre / elemincre) * local_71b8 + rowlen * local_7190 + startpos;
          if (tcode == 0x52) {
            ffgr8b(local_71c0,lVar7,nvals,incre,cbuff,status);
            fffr8s1(cbuff,nvals,scale,zero,local_71fc,nulval,pcVar4,anynul,(char *)values,status);
          }
          else if (tcode == 0x10) {
            ffmbyt(local_71c0,lVar7,0,status);
            if (incre - twidth == 0) {
              ffgbyt(pfVar2,incre * nvals,cbuff,status);
            }
            else {
              ffgbytoff(pfVar2,twidth,nvals,incre - twidth,cbuff,status);
            }
            fffstrs1((char *)cbuff,nvals,scale,zero,twidth,local_7180,local_71fc,snull,nulval,pcVar4
                     ,anynul,(char *)values,status);
          }
          else if (tcode == 0x15) {
            ffgi2b(local_71c0,lVar7,nvals,incre,(short *)cbuff,status);
            fffi2s1((short *)cbuff,nvals,scale,zero,local_71fc,(short)tnull,nulval,pcVar4,anynul,
                    (char *)values,status);
          }
          else if (tcode == 0x29) {
            ffgi4b(local_71c0,lVar7,nvals,incre,(int *)cbuff,status);
            fffi4s1((int *)cbuff,nvals,scale,zero,local_71fc,(int)tnull,nulval,pcVar4,anynul,
                    (char *)values,status);
          }
          else if (tcode == 0x2a) {
            ffgr4b(local_71c0,lVar7,nvals,incre,(float *)cbuff,status);
            fffr4s1((float *)cbuff,nvals,scale,zero,local_71fc,nulval,pcVar4,anynul,(char *)values,
                    status);
          }
          else if (tcode == 0x51) {
            ffgi8b(local_71c0,lVar7,nvals,incre,(long *)cbuff,status);
            fffi8s1((LONGLONG *)cbuff,nvals,scale,zero,local_71fc,tnull,nulval,pcVar4,anynul,
                    (char *)values,status);
          }
          else {
            if (tcode != 0xb) {
              snprintf(message,0x51,"Cannot read bytes from column %d which has format %s",
                       (ulong)local_71d4,tform);
              ffpmsg(message);
              if (hdutype == 1) {
                *status = 0x137;
                return 0x137;
              }
              *status = 0x138;
              return 0x138;
            }
            ffgi1b(local_71c0,lVar7,nvals,incre,values,status);
            fffi1s1(values,nvals,scale,zero,local_71fc,(uchar)tnull,nulval,pcVar4,anynul,
                    (char *)values,status);
          }
          if (0 < *status) {
            dVar10 = (double)local_7198 + 1.0;
            dVar11 = (double)nvals + (double)local_7198;
            if (hdutype < 1) {
              snprintf(message,0x51,"Error reading elements %.0f thru %.0f from image (ffgclsb).",
                       dVar10,dVar11);
            }
            else {
              snprintf(message,0x51,
                       "Error reading elements %.0f thru %.0f from column %d (ffgclsb).",dVar10,
                       dVar11,(ulong)local_71d4);
            }
            ffpmsg(message);
            goto LAB_001524f9;
          }
          nelem = nelem - nvals;
        } while (nelem == 0);
        local_7198 = local_7198 + nvals;
        local_71b8 = nvals * elemincre + local_71b8;
        if ((long)local_71b8 < repeat) goto code_r0x00152a96;
        lVar7 = (long)local_71b8 / repeat;
        local_71b8 = (long)local_71b8 % repeat;
        goto LAB_00152adb;
      }
    }
  }
  return iVar3;
code_r0x00152a96:
  if ((long)local_71b8 < 0) {
    lVar6 = (long)~local_71b8 / repeat + 1;
    lVar7 = -lVar6;
    local_71b8 = lVar6 * repeat + local_71b8;
LAB_00152adb:
    local_7190 = local_7190 + lVar7;
  }
  goto LAB_001526fe;
}

Assistant:

int ffgclsb(fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            long  elemincre,  /* I - pixel increment; e.g., 2 = every other  */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            signed char nulval,   /* I - value for null pixels if nultyp = 1 */
            signed char *array,   /* O - array of values that are read       */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer be a virtual column in a 1 or more grouped FITS primary
  array or image extension.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The output array of values will be converted from the datatype of the column 
  and will be scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    double scale, zero, power = 1., dtemp;
    int tcode, maxelem, hdutype, xcode, decimals;
    long twidth, incre;
    long ii, xwidth, ntodo;
    int nulcheck, readcheck = 0;
    LONGLONG repeat, startpos, elemnum, readptr, tnull;
    LONGLONG rowlen, rownum, remain, next, rowincre;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value if reading from ASCII table  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    union u_tag {
       char charval;
       signed char scharval;
    } u;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    buffer = cbuff;

    if (anynul)
        *anynul = 0;

    if (nultyp == 2)      
       memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (elemincre < 0)
        readcheck = -1;  /* don't do range checking in this case */

    ffgcprll( fptr, colnum, firstrow, firstelem, nelem, readcheck, &scale, &zero,
         tform, &twidth, &tcode, &maxelem, &startpos, &elemnum, &incre,
         &repeat, &rowlen, &hdutype, &tnull, snull, status);

    /* special case: read column of T/F logicals */
    if (tcode == TLOGICAL && elemincre == 1)
    {
        u.scharval = nulval;
        ffgcll(fptr, colnum, firstrow, firstelem, nelem, nultyp,
               u.charval, (char *) array, nularray, anynul, status);

        return(*status);
    }

    if (strchr(tform,'A') != NULL) 
    {
        if (*status == BAD_ELEM_NUM)
        {
            /* ignore this error message */
            *status = 0;
            ffcmsg();   /* clear error stack */
        }

        /*  interpret a 'A' ASCII column as a 'B' byte column ('8A' == '8B') */
        /*  This is an undocumented 'feature' in CFITSIO */

        /*  we have to reset some of the values returned by ffgcpr */
        
        tcode = TBYTE;
        incre = 1;         /* each element is 1 byte wide */
        repeat = twidth;   /* total no. of chars in the col */
        twidth = 1;        /* width of each element */
        scale = 1.0;       /* no scaling */
        zero  = 0.0;
        tnull = NULL_UNDEFINED;  /* don't test for nulls */
        maxelem = DBUFFSIZE;
    }

    if (*status > 0)
        return(*status);
        
    incre *= elemincre;   /* multiply incre to just get every nth pixel */

    if (tcode == TSTRING && hdutype == ASCII_TBL) /* setup for ASCII tables */
    {
      /* get the number of implied decimal places if no explicit decmal point */
      ffasfm(tform, &xcode, &xwidth, &decimals, status); 
      for(ii = 0; ii < decimals; ii++)
        power *= 10.;
    }
    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default, check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (tcode%10 == 1 &&        /* if reading an integer column, and  */ 
            tnull == NULL_UNDEFINED) /* if a null value is not defined,    */
            nulcheck = 0;            /* then do not check for null values. */

    else if (tcode == TSHORT && (tnull > SHRT_MAX || tnull < SHRT_MIN) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TBYTE && (tnull > 255 || tnull < 0) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TSTRING && snull[0] == ASCII_NULL_UNDEFINED)
         nulcheck = 0;

    /*---------------------------------------------------------------------*/
    /*  Now read the pixels from the FITS column. If the column does not   */
    /*  have the same datatype as the output array, then we have to read   */
    /*  the raw values into a temporary buffer (of limited size).  In      */
    /*  the case of a vector colum read only 1 vector of values at a time  */
    /*  then skip to the next row if more values need to be read.          */
    /*  After reading the raw values, then call the fffXXYY routine to (1) */
    /*  test for undefined values, (2) convert the datatype if necessary,  */
    /*  and (3) scale the values by the FITS TSCALn and TZEROn linear      */
    /*  scaling parameters.                                                */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to read */
    next = 0;                 /* next element in array to be read   */
    rownum = 0;               /* row number, relative to firstrow   */

    while (remain)
    {
        /* limit the number of pixels to read at one time to the number that
           will fit in the buffer or to the number of pixels that remain in
           the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);
        if (elemincre >= 0)
        {
          ntodo = (long) minvalue(ntodo, ((repeat - elemnum - 1)/elemincre +1));
        }
        else
        {
          ntodo = (long) minvalue(ntodo, (elemnum/(-elemincre) +1));
        }

        readptr = startpos + (rownum * rowlen) + (elemnum * (incre / elemincre));

        switch (tcode) 
        {
            case (TBYTE):
                ffgi1b(fptr, readptr, ntodo, incre, (unsigned char *) &array[next], status);
                fffi1s1((unsigned char *)&array[next], ntodo, scale, zero,
                        nulcheck, (unsigned char) tnull, nulval, &nularray[next], 
                        anynul, &array[next], status);
                break;
            case (TSHORT):
                ffgi2b(fptr, readptr, ntodo, incre, (short *) buffer, status);
                fffi2s1((short  *) buffer, ntodo, scale, zero, nulcheck, 
                       (short) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONG):
                ffgi4b(fptr, readptr, ntodo, incre, (INT32BIT *) buffer,
                       status);
                fffi4s1((INT32BIT *) buffer, ntodo, scale, zero, nulcheck, 
                       (INT32BIT) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONGLONG):
                ffgi8b(fptr, readptr, ntodo, incre, (long *) buffer, status);
                fffi8s1( (LONGLONG *) buffer, ntodo, scale, zero, 
                           nulcheck, tnull, nulval, &nularray[next], 
                            anynul, &array[next], status);
                break;
            case (TFLOAT):
                ffgr4b(fptr, readptr, ntodo, incre, (float  *) buffer, status);
                fffr4s1((float  *) buffer, ntodo, scale, zero, nulcheck, 
                       nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TDOUBLE):
                ffgr8b(fptr, readptr, ntodo, incre, (double *) buffer, status);
                fffr8s1((double *) buffer, ntodo, scale, zero, nulcheck, 
                          nulval, &nularray[next], anynul, 
                          &array[next], status);
                break;
            case (TSTRING):
                ffmbyt(fptr, readptr, REPORT_EOF, status);
       
                if (incre == twidth)    /* contiguous bytes */
                     ffgbyt(fptr, ntodo * twidth, buffer, status);
                else
                     ffgbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);

                /* interpret the string as an ASCII formated number */
                fffstrs1((char *) buffer, ntodo, scale, zero, twidth, power,
                      nulcheck, snull, nulval, &nularray[next], anynul,
                      &array[next], status);
                break;

            default:  /*  error trap for invalid column format */
                snprintf(message, FLEN_ERRMSG,
                   "Cannot read bytes from column %d which has format %s",
                    colnum, tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous read operation */
        {
	  dtemp = (double) next;
          if (hdutype > 0)
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from column %d (ffgclsb).",
              dtemp+1., dtemp+ntodo, colnum);
          else
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from image (ffgclsb).",
              dtemp+1., dtemp+ntodo);

         ffpmsg(message);
         return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum = elemnum + (ntodo * elemincre);

            if (elemnum >= repeat)  /* completed a row; start on later row */
            {
                rowincre = elemnum / repeat;
                rownum += rowincre;
                elemnum = elemnum - (rowincre * repeat);
            }
            else if (elemnum < 0)  /* completed a row; start on a previous row */
            {
                rowincre = (-elemnum - 1) / repeat + 1;
                rownum -= rowincre;
                elemnum = (rowincre * repeat) + elemnum;
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
        ffpmsg(
        "Numerical overflow during type conversion while reading FITS data.");
        *status = NUM_OVERFLOW;
    }

    return(*status);
}